

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

void __thiscall
bandit::detail::option_map::add
          (option_map *this,string *name,controller_func_t *func,bool is_default)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_bool>
  pVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>
  local_58;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>
  ::pair<std::function<void_(bandit::detail::controller_t_&)>_&,_true>(&local_58,name,func);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>>>
          ::
          _M_emplace_unique<std::pair<std::__cxx11::string,std::function<void(bandit::detail::controller_t&)>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>>>
                      *)this,&local_58);
  if (local_58.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.second.super__Function_base._M_manager)
              ((_Any_data *)&local_58.second,(_Any_data *)&local_58.second,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((is_default) || ((this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1)) {
    (this->default_it)._M_node = pVar1.first._M_node._M_node;
  }
  return;
}

Assistant:

void add(const std::string& name, controller_func_t func, bool is_default = false) {
        auto it = map.emplace(std::make_pair(name, func));
        if (is_default || map.size() == 1) {
          default_it = it.first;
        }
      }